

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_VRR_Writer::WriteVRRFile(OSTEI_VRR_Writer *this,ostream *os,ostream *osh)

{
  char *pcVar1;
  bool bVar2;
  RRStepType RVar3;
  ostream *poVar4;
  int *piVar5;
  QAM *am_00;
  int *piVar6;
  OSTEI_VRR_Algorithm_Base *this_00;
  QAM *am_01;
  QAM *am_02;
  ostream *in_RDX;
  ostream *in_RSI;
  string *in_stack_000000f0;
  VRR_StepSet *in_stack_000000f8;
  QAM *in_stack_00000100;
  ostream *in_stack_00000108;
  OSTEI_VRR_Writer *in_stack_00000110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_6;
  iterator __end2_4;
  iterator __begin2_4;
  StringSet *__range2_4;
  QAM *it_5;
  iterator __end2_3;
  iterator __begin2_3;
  QAMList *__range2_3;
  QAM tocall;
  int *it_4;
  iterator __end2_2;
  iterator __begin2_2;
  IntSet *__range2_2;
  int *it_3;
  iterator __end2_1;
  iterator __begin2_1;
  IntSet *__range2_1;
  int *it_2;
  iterator __end2;
  iterator __begin2;
  IntSet *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_1;
  iterator __end1_1;
  iterator __begin1_1;
  StringSet *__range1_1;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMList *__range1;
  string stepchar;
  stringstream prototype;
  RRStepType rrstep;
  QAM am;
  GeneratorInfoBase *in_stack_fffffffffffff538;
  OSTEI_VRR_Algorithm_Base *in_stack_fffffffffffff540;
  QAM *in_stack_fffffffffffff550;
  OSTEI_VRR_Algorithm_Base *in_stack_fffffffffffff558;
  QAM *in_stack_fffffffffffff588;
  QAM *in_stack_fffffffffffff5e0;
  OSTEI_VRR_Algorithm_Base *in_stack_fffffffffffff5e8;
  QAM *in_stack_fffffffffffff660;
  OSTEI_VRR_Algorithm_Base *in_stack_fffffffffffff668;
  allocator *paVar7;
  string *in_stack_fffffffffffff730;
  string local_728 [32];
  string *local_708;
  _Self local_700;
  _Self local_6f8 [7];
  undefined1 local_6c0 [48];
  undefined1 *local_690;
  string local_688 [32];
  reference local_668;
  QAM *local_660;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> local_658 [7];
  undefined1 local_620 [24];
  undefined1 *local_608;
  string local_600 [87];
  allocator local_5a9;
  string local_5a8 [176];
  int *local_4f8;
  _Self local_4f0;
  _Self local_4e8 [7];
  undefined1 local_4b0 [48];
  undefined1 *local_480;
  int *local_478;
  _Self local_470;
  _Self local_468 [7];
  undefined1 local_430 [48];
  undefined1 *local_400;
  int *local_3f8;
  _Self local_3f0;
  _Self local_3e8 [7];
  undefined1 local_3b0 [48];
  undefined1 *local_380;
  string local_378 [32];
  reference local_358;
  _Self local_350;
  _Self local_348 [7];
  undefined1 local_310 [48];
  undefined1 *local_2e0;
  string local_2d8 [32];
  reference local_2b8;
  QAM *local_2b0;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> local_2a8 [7];
  undefined1 local_270 [24];
  undefined1 *local_258;
  string local_250 [32];
  string local_230 [32];
  stringstream local_210 [16];
  ostream local_200 [424];
  RRStepType local_58;
  ostream *local_18;
  ostream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  GeneratorInfoBase::FinalAM(in_stack_fffffffffffff538);
  std::operator<<(local_10,"//////////////////////////////////////////////\n");
  poVar4 = std::operator<<(local_10,"// VRR: ( ");
  pcVar1 = amchar;
  piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                           (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
  poVar4 = std::operator<<(poVar4,pcVar1[*piVar5]);
  poVar4 = std::operator<<(poVar4," ");
  pcVar1 = amchar;
  piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                           (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
  poVar4 = std::operator<<(poVar4,pcVar1[*piVar5]);
  poVar4 = std::operator<<(poVar4," | ");
  pcVar1 = amchar;
  piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                           (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
  poVar4 = std::operator<<(poVar4,pcVar1[*piVar5]);
  poVar4 = std::operator<<(poVar4," ");
  pcVar1 = amchar;
  piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                           (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
  poVar4 = std::operator<<(poVar4,pcVar1[*piVar5]);
  std::operator<<(poVar4," )\n");
  std::operator<<(local_10,"//////////////////////////////////////////////\n");
  QAM::QAM((QAM *)in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
  RVar3 = OSTEI_VRR_Algorithm_Base::GetRRStep
                    (in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
  QAM::~QAM((QAM *)0x144c91);
  local_58 = RVar3;
  std::__cxx11::stringstream::stringstream(local_210);
  RRStepTypeToStr_abi_cxx11_((RRStepType)((ulong)in_stack_fffffffffffff588 >> 0x20));
  poVar4 = std::operator<<(local_200,"void VRR_");
  poVar4 = std::operator<<(poVar4,local_230);
  poVar4 = std::operator<<(poVar4,"_");
  pcVar1 = amchar;
  piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                           (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
  poVar4 = std::operator<<(poVar4,pcVar1[*piVar5]);
  poVar4 = std::operator<<(poVar4,"_");
  pcVar1 = amchar;
  piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                           (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
  poVar4 = std::operator<<(poVar4,pcVar1[*piVar5]);
  poVar4 = std::operator<<(poVar4,"_");
  pcVar1 = amchar;
  piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                           (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
  poVar4 = std::operator<<(poVar4,pcVar1[*piVar5]);
  poVar4 = std::operator<<(poVar4,"_");
  pcVar1 = amchar;
  piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                           (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
  poVar4 = std::operator<<(poVar4,pcVar1[*piVar5]);
  std::operator<<(poVar4,"(\n");
  poVar4 = std::operator<<(local_200,(string *)indent3_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"SIMINT_DBLTYPE * const restrict ");
  PrimVarName_abi_cxx11_(in_stack_fffffffffffff588);
  poVar4 = std::operator<<(poVar4,local_250);
  std::operator<<(poVar4,",\n");
  std::__cxx11::string::~string(local_250);
  QAM::QAM((QAM *)in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
  OSTEI_VRR_Algorithm_Base::GetAMReq(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
  QAM::~QAM((QAM *)0x144fdc);
  local_258 = local_270;
  local_2a8[0]._M_current =
       (QAM *)std::vector<QAM,_std::allocator<QAM>_>::begin
                        ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffff538);
  local_2b0 = (QAM *)std::vector<QAM,_std::allocator<QAM>_>::end
                               ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffff538);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                            in_stack_fffffffffffff540,
                            (__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                            in_stack_fffffffffffff538), bVar2) {
    local_2b8 = __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::
                operator*(local_2a8);
    poVar4 = std::operator<<(local_200,(string *)indent3_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE * const restrict ");
    PrimVarName_abi_cxx11_(in_stack_fffffffffffff588);
    poVar4 = std::operator<<(poVar4,local_2d8);
    std::operator<<(poVar4,",\n");
    std::__cxx11::string::~string(local_2d8);
    __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator++
              (local_2a8);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector
            ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffff550);
  QAM::QAM((QAM *)in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
  OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_
            (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0);
  QAM::~QAM((QAM *)0x14525e);
  local_2e0 = local_310;
  local_348[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff538);
  local_350._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff538);
  while (bVar2 = std::operator!=(local_348,&local_350), bVar2) {
    local_358 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x1452f6);
    bVar2 = IsPointer(in_stack_fffffffffffff730);
    if (bVar2) {
      poVar4 = std::operator<<(local_200,(string *)indent3_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE * ");
      poVar4 = std::operator<<(poVar4,(string *)local_358);
      std::operator<<(poVar4,",\n");
    }
    else {
      poVar4 = std::operator<<(local_200,(string *)indent3_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE ");
      poVar4 = std::operator<<(poVar4,(string *)local_358);
      std::operator<<(poVar4,",\n");
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff540);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1452be);
  poVar4 = std::operator<<(local_200,(string *)indent3_abi_cxx11_);
  std::operator<<(poVar4,"const int num_n)");
  poVar4 = local_10;
  std::__cxx11::stringstream::str();
  poVar4 = std::operator<<(poVar4,local_378);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string(local_378);
  std::operator<<(local_10,"{\n");
  piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                           (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
  if ((*piVar5 == 0) &&
     (piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                               (int)((ulong)in_stack_fffffffffffff538 >> 0x20)), *piVar5 == 0)) {
    std::operator<<(local_10,"    int n = 0;\n");
    QAM::QAM((QAM *)in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
    OSTEI_VRR_Algorithm_Base::GetIntReq_2p(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
    QAM::~QAM((QAM *)0x1455c1);
    local_380 = local_3b0;
    local_3e8[0]._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff538);
    local_3f0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff538);
    while (bVar2 = std::operator!=(local_3e8,&local_3f0), bVar2) {
      local_3f8 = std::_Rb_tree_const_iterator<int>::operator*
                            ((_Rb_tree_const_iterator<int> *)0x14567f);
      poVar4 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE vrr_const_");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_3f8);
      poVar4 = std::operator<<(poVar4,"_over_2p = SIMINT_MUL(SIMINT_DBLSET1(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_3f8);
      std::operator<<(poVar4,"), one_over_2p);\n");
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffff540);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x145621);
    QAM::QAM((QAM *)in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
    OSTEI_VRR_Algorithm_Base::GetIntReq_2q(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
    QAM::~QAM((QAM *)0x1457ca);
    local_400 = local_430;
    local_468[0]._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff538);
    local_470._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff538);
    while (bVar2 = std::operator!=(local_468,&local_470), bVar2) {
      local_478 = std::_Rb_tree_const_iterator<int>::operator*
                            ((_Rb_tree_const_iterator<int> *)0x145862);
      poVar4 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE vrr_const_");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_478);
      poVar4 = std::operator<<(poVar4,"_over_2q = SIMINT_MUL(SIMINT_DBLSET1(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_478);
      std::operator<<(poVar4,"), one_over_2q);\n");
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffff540);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x14582a);
    QAM::QAM((QAM *)in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
    OSTEI_VRR_Algorithm_Base::GetIntReq_2pq(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
    QAM::~QAM((QAM *)0x1459ad);
    local_480 = local_4b0;
    local_4e8[0]._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff538);
    local_4f0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff538);
    while (bVar2 = std::operator!=(local_4e8,&local_4f0), bVar2) {
      local_4f8 = std::_Rb_tree_const_iterator<int>::operator*
                            ((_Rb_tree_const_iterator<int> *)0x145a45);
      poVar4 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"const SIMINT_DBLTYPE vrr_const_");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_4f8);
      poVar4 = std::operator<<(poVar4,"_over_2pq = SIMINT_MUL(SIMINT_DBLSET1(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_4f8);
      std::operator<<(poVar4,"), one_over_2pq);\n");
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffff540);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x145a0d);
    QAM::QAM((QAM *)in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
    QAM::QAM((QAM *)in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
    OSTEI_VRR_Algorithm_Base::GetSteps(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
    paVar7 = &local_5a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5a8,"num_n",paVar7);
    WriteVRRSteps_(in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                   in_stack_000000f0);
    std::__cxx11::string::~string(local_5a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
    std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::~set
              ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)0x145c33);
    QAM::~QAM((QAM *)0x145c40);
    QAM::~QAM((QAM *)0x145c4d);
  }
  else {
    QAM::QAM((QAM *)in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
    am_00 = (QAM *)QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                                   (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
    if ((am_00->qam)._M_elems[0] == 0) {
      piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                               (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
      piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                               (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
      std::swap<int>(piVar5,piVar6);
    }
    piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                             (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
    if (*piVar5 == 0) {
      piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                               (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
      piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                               (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
      std::swap<int>(piVar5,piVar6);
    }
    if (local_58 == J) {
      std::__cxx11::string::operator=(local_230,'I');
    }
    else if (local_58 == L) {
      std::__cxx11::string::operator=(local_230,'K');
    }
    poVar4 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
    std::operator<<(poVar4,"// Routines are identical except for swapping of\n");
    poVar4 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
    std::operator<<(poVar4,"// PA with PB and QC with QD\n");
    std::operator<<(local_10,"\n");
    poVar4 = std::operator<<(local_10,(string *)indent1_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"VRR_");
    poVar4 = std::operator<<(poVar4,local_230);
    poVar4 = std::operator<<(poVar4,"_");
    pcVar1 = amchar;
    piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                             (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
    poVar4 = std::operator<<(poVar4,pcVar1[*piVar5]);
    this_00 = (OSTEI_VRR_Algorithm_Base *)std::operator<<(poVar4,"_");
    pcVar1 = amchar;
    am_01 = (QAM *)QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                                   (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
    poVar4 = std::operator<<((ostream *)this_00,pcVar1[(am_01->qam)._M_elems[0]]);
    poVar4 = std::operator<<(poVar4,"_");
    pcVar1 = amchar;
    piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                             (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
    poVar4 = std::operator<<(poVar4,pcVar1[*piVar5]);
    poVar4 = std::operator<<(poVar4,"_");
    pcVar1 = amchar;
    piVar5 = QAM::operator[]((QAM *)in_stack_fffffffffffff540,
                             (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
    poVar4 = std::operator<<(poVar4,pcVar1[*piVar5]);
    std::operator<<(poVar4,"(\n");
    am_02 = (QAM *)std::operator<<(local_10,(string *)indent3_abi_cxx11_);
    PrimVarName_abi_cxx11_(am_02);
    poVar4 = std::operator<<((ostream *)am_02,local_600);
    std::operator<<(poVar4,",\n");
    std::__cxx11::string::~string(local_600);
    QAM::QAM((QAM *)in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
    OSTEI_VRR_Algorithm_Base::GetAMReq(in_stack_fffffffffffff668,am_00);
    QAM::~QAM((QAM *)0x1461ae);
    local_608 = local_620;
    local_658[0]._M_current =
         (QAM *)std::vector<QAM,_std::allocator<QAM>_>::begin
                          ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffff538);
    local_660 = (QAM *)std::vector<QAM,_std::allocator<QAM>_>::end
                                 ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffff538);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                              in_stack_fffffffffffff540,
                              (__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                              in_stack_fffffffffffff538), bVar2) {
      local_668 = __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::
                  operator*(local_658);
      poVar4 = std::operator<<(local_10,(string *)indent3_abi_cxx11_);
      PrimVarName_abi_cxx11_(am_02);
      poVar4 = std::operator<<(poVar4,local_688);
      std::operator<<(poVar4,",\n");
      std::__cxx11::string::~string(local_688);
      __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator++
                (local_658);
    }
    std::vector<QAM,_std::allocator<QAM>_>::~vector
              ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffff550);
    QAM::QAM((QAM *)in_stack_fffffffffffff540,(QAM *)in_stack_fffffffffffff538);
    OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_(this_00,am_01);
    QAM::~QAM((QAM *)0x14638b);
    local_690 = local_6c0;
    local_6f8[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff538);
    local_700._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff538);
    while (bVar2 = std::operator!=(local_6f8,&local_700), bVar2) {
      local_708 = (string *)
                  std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x146423);
      poVar4 = std::operator<<(local_10,(string *)indent3_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,local_708);
      std::operator<<(poVar4,",\n");
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff540);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1463eb);
    poVar4 = std::operator<<(local_10,(string *)indent3_abi_cxx11_);
    std::operator<<(poVar4,"num_n);");
    QAM::~QAM((QAM *)0x1464e4);
  }
  std::operator<<(local_10,"\n");
  std::operator<<(local_10,"}\n");
  std::operator<<(local_10,"\n\n");
  std::__cxx11::stringstream::str();
  poVar4 = std::operator<<(local_18,local_728);
  std::operator<<(poVar4,";\n\n");
  std::__cxx11::string::~string(local_728);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::stringstream::~stringstream(local_210);
  QAM::~QAM((QAM *)0x1465bc);
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRRFile(std::ostream & os, std::ostream & osh) const
{
    QAM am = info_.FinalAM();

    os << "//////////////////////////////////////////////\n";
    os << "// VRR: ( " << amchar[am[0]] << " " << amchar[am[1]] << " | " << amchar[am[2]] << " " << amchar[am[3]] << " )\n";
    os << "//////////////////////////////////////////////\n";

    RRStepType rrstep = vrr_algo_.GetRRStep(am);

    std::stringstream prototype;

    std::string stepchar = RRStepTypeToStr(rrstep);

    prototype << "void VRR_" << stepchar << "_"
              << amchar[am[0]] << "_" << amchar[am[1]] << "_"
              << amchar[am[2]] << "_" << amchar[am[3]]  << "(\n";

    // final target
    prototype << indent3 << "SIMINT_DBLTYPE * const restrict " << PrimVarName(am) << ",\n";

    for(const auto & it : vrr_algo_.GetAMReq(am))
        prototype << indent3 << "const SIMINT_DBLTYPE * const restrict " << PrimVarName(it) << ",\n";
    
    for(const auto & it : vrr_algo_.GetVarReq(am))
    {
        if(IsPointer(it))
            prototype << indent3 << "const SIMINT_DBLTYPE * " << it << ",\n";
        else
            prototype << indent3 << "const SIMINT_DBLTYPE " << it << ",\n";
    }

    prototype << indent3 << "const int num_n)";

    os << prototype.str() << "\n";
    os << "{\n";


    // is this in standard order, or one of the permutations?
    if(am[1] == 0 && am[3] == 0)
    {
        // standard ( X s | Y s )
        // Make this one

        os << "    int n = 0;\n";

        for(const auto & it : vrr_algo_.GetIntReq_2p(am))
            os << indent1 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2p = SIMINT_MUL(SIMINT_DBLSET1(" << it << "), one_over_2p);\n"; 

        for(const auto & it : vrr_algo_.GetIntReq_2q(am))
            os << indent1 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2q = SIMINT_MUL(SIMINT_DBLSET1(" << it << "), one_over_2q);\n"; 

        for(const auto & it : vrr_algo_.GetIntReq_2pq(am))
            os << indent1 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2pq = SIMINT_MUL(SIMINT_DBLSET1(" << it << "), one_over_2pq);\n"; 

        // Write out the steps
        WriteVRRSteps_(os, am, vrr_algo_.GetSteps(am), "num_n");

    }
    else
    {
        // permutation. Call one of the others
        QAM tocall = am;
        if(am[0] == 0)
            std::swap(tocall[0], tocall[1]);
        if(am[2] == 0)
            std::swap(tocall[2], tocall[3]);

        if(rrstep == RRStepType::J)
            stepchar = 'I';
        else if(rrstep == RRStepType::L)
            stepchar = 'K';

        os << indent1 << "// Routines are identical except for swapping of\n";
        os << indent1 << "// PA with PB and QC with QD\n";
        os << "\n";
        os << indent1 << "VRR_" << stepchar << "_"
                      << amchar[tocall[0]] << "_" << amchar[tocall[1]] << "_"
                      << amchar[tocall[2]] << "_" << amchar[tocall[3]]  << "(\n";
    
        // final target
        os << indent3 << PrimVarName(am) << ",\n";
        
        for(const auto & it : vrr_algo_.GetAMReq(am))
            os << indent3 << PrimVarName(it) << ",\n";
    
        for(const auto & it : vrr_algo_.GetVarReq(am))
            os << indent3 << it << ",\n";

        os << indent3 << "num_n);";
    }

    os << "\n";
    os << "}\n";
    os << "\n\n";

    // header
    osh << prototype.str() << ";\n\n";
}